

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::TrendGroup> * metaf::TrendGroup::fromFm(string *s)

{
  bool bVar1;
  int iVar2;
  ulong in_RSI;
  TrendGroup *in_RDI;
  TrendGroup result;
  optional<metaf::MetafTime> time;
  TrendGroup *__t;
  TrendGroup *__re;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  flag_type in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffb0;
  TrendGroup local_48;
  
  __re = in_RDI;
  local_48.tAt.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::MetafTime>._12_8_ = in_RSI;
  if (fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_);
    }
  }
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)__re,
                     (match_flag_type)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    __t = &local_48;
    std::__cxx11::string::substr
              ((ulong)__t,
               local_48.tAt.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._12_8_);
    MetafTime::fromStringDDHHMM(in_stack_ffffffffffffffb0);
    std::__cxx11::string::~string((string *)&local_48);
    bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x23f647);
    if (bVar1) {
      TrendGroup(in_RDI);
      std::optional<metaf::TrendGroup>::optional<metaf::TrendGroup,_true>
                ((optional<metaf::TrendGroup> *)in_RDI,__t);
    }
    else {
      memcpy(in_RDI,&fromFm::notRecognised,0x4c);
    }
  }
  else {
    memcpy(in_RDI,&fromFm::notRecognised,0x4c);
  }
  return (optional<metaf::TrendGroup> *)__re;
}

Assistant:

std::optional<TrendGroup> TrendGroup::fromFm(const std::string & s) {
	static const std::optional<TrendGroup> notRecognised;
	static const std::regex rgx("FM\\d\\d\\d\\d\\d\\d");
	static const auto posTime = 2, lenTime = 6;
	if (!regex_match(s, rgx)) return notRecognised;
	const auto time = MetafTime::fromStringDDHHMM(s.substr(posTime, lenTime));
	if (!time.has_value()) return notRecognised;

	TrendGroup result;
	result.t = Type::FROM;
	result.tFrom = time;
	return result;
}